

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ulong __thiscall nuraft::inmem_log_store::next_slot(inmem_log_store *this)

{
  __int_type _Var1;
  size_type sVar2;
  ulong uVar3;
  mutex_type *in_RDI;
  lock_guard<std::mutex> l;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffffe8;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffe8);
  sVar2 = std::
          map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
          ::size((map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                  *)0x1cfe4f);
  uVar3 = (_Var1 + sVar2) - 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1cfe6d);
  return uVar3;
}

Assistant:

ulong inmem_log_store::next_slot() const {
    std::lock_guard<std::mutex> l(logs_lock_);
    // Exclude the dummy entry.
    return start_idx_ + logs_.size() - 1;
}